

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CInstIterNext(CInstIter *pIter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int io;
  int ic;
  int ip;
  int local_3c;
  int local_38;
  int local_34;
  
  pIter->iStart = -1;
  pIter->iEnd = -1;
  iVar2 = 0;
  do {
    if (iVar2 != 0) {
      return iVar2;
    }
    if (pIter->nInst <= pIter->iInst) {
      return 0;
    }
    iVar2 = (*pIter->pApi->xInst)(pIter->pFts,pIter->iInst,&local_34,&local_38,&local_3c);
    iVar4 = local_3c;
    iVar3 = 0;
    if (iVar2 == 0) {
      if (local_38 == pIter->iCol) {
        iVar3 = (*pIter->pApi->xPhraseSize)(pIter->pFts,local_34);
        iVar4 = iVar3 + iVar4 + -1;
        if (pIter->iStart < 0) {
          pIter->iStart = local_3c;
LAB_001d743a:
          pIter->iEnd = iVar4;
          iVar3 = 0;
          bVar1 = true;
        }
        else {
          iVar3 = 0;
          if (pIter->iEnd < local_3c) {
            iVar3 = 3;
            bVar1 = false;
          }
          else {
            bVar1 = true;
            if (pIter->iEnd < iVar4) goto LAB_001d743a;
          }
        }
        if (!bVar1) goto LAB_001d744a;
      }
      pIter->iInst = pIter->iInst + 1;
      iVar3 = 0;
    }
LAB_001d744a:
    if (iVar3 != 0) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static int fts5CInstIterNext(CInstIter *pIter){
  int rc = SQLITE_OK;
  pIter->iStart = -1;
  pIter->iEnd = -1;

  while( rc==SQLITE_OK && pIter->iInst<pIter->nInst ){
    int ip; int ic; int io;
    rc = pIter->pApi->xInst(pIter->pFts, pIter->iInst, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      if( ic==pIter->iCol ){
        int iEnd = io - 1 + pIter->pApi->xPhraseSize(pIter->pFts, ip);
        if( pIter->iStart<0 ){
          pIter->iStart = io;
          pIter->iEnd = iEnd;
        }else if( io<=pIter->iEnd ){
          if( iEnd>pIter->iEnd ) pIter->iEnd = iEnd;
        }else{
          break;
        }
      }
      pIter->iInst++;
    }
  }

  return rc;
}